

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::anon_struct_560_16_3a89ef90::resizeBuffers<unsigned_long>
          (anon_struct_560_16_3a89ef90 *this,unsigned_long stateDim,unsigned_long controlDim)

{
  iDynTree::VectorDynSize::resize((ulong)&this->stateJacobianBuffer);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::resize((ulong)&this->controlJacobianBuffer);
  iDynTree::VectorDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)&this->stateHessianBuffer,stateDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)&this->controlHessianBuffer,controlDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)&this->mixedHessianBuffer,stateDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  return;
}

Assistant:

void resizeBuffers(intType stateDim, intType controlDim) {
                unsigned int nx = static_cast<unsigned int>(stateDim);
                unsigned int nu = static_cast<unsigned int>(controlDim);
                stateJacobianBuffer.resize(nx);
                stateJacobianBuffer.zero();
                controlJacobianBuffer.resize(nu);
                controlJacobianBuffer.zero();
                stateHessianBuffer.resize(nx, nx);
                stateHessianBuffer.zero();
                controlHessianBuffer.resize(nu, nu);
                controlHessianBuffer.zero();
                mixedHessianBuffer.resize(nx, nu);
                mixedHessianBuffer.zero();
            }